

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msaa.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if (action == 1) {
    if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
    if (key == 0x20) {
      glfwSetTime(0.0);
      return;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_SPACE:
            glfwSetTime(0.0);
            break;
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
    }
}